

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.cpp
# Opt level: O2

string * __thiscall
pbrt::detail::FloatToString_abi_cxx11_(string *__return_storage_ptr__,detail *this,float v)

{
  char buf [64];
  StringBuilder local_90;
  char local_78 [64];
  DoubleToStringConverter local_38;
  
  local_38.flags_ = 0;
  local_38.infinity_symbol_ = "Inf";
  local_38.nan_symbol_ = "NaN";
  local_90.buffer_.start_ = local_78;
  local_38.exponent_character_ = 'e';
  local_90.buffer_.length_ = 0x40;
  local_90.position_ = 0;
  local_38.decimal_in_shortest_low_ = -6;
  local_38.decimal_in_shortest_high_ = 9;
  local_38.max_leading_padding_zeroes_in_precision_mode_ = 5;
  local_38.max_trailing_padding_zeroes_in_precision_mode_ = 5;
  local_38.min_exponent_width_ = 0;
  double_conversion::DoubleToStringConverter::ToShortestSingle(&local_38,v,&local_90);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,local_78,local_78 + local_90.position_);
  if (-1 < (long)local_90.position_) {
    local_90.buffer_.start_[local_90.position_] = '\0';
  }
  return __return_storage_ptr__;
}

Assistant:

std::string FloatToString(float v) {
    double_conversion::DoubleToStringConverter doubleConverter(
        double_conversion::DoubleToStringConverter::NO_FLAGS, "Inf", "NaN", 'e',
        -6 /* decimal_in_shortest_low */, 9 /* decimal_in_shortest_high */,
        5 /* max_leading_padding_zeroes_in_precision_mode */,
        5 /*  max_trailing_padding_zeroes_in_precision_mode */);
    char buf[64];
    double_conversion::StringBuilder result(buf, PBRT_ARRAYSIZE(buf));
    doubleConverter.ToShortestSingle(v, &result);
    int length = result.position();
    return std::string(buf, length);
}